

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::FilesDiffer(string *source,string *destination)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  streamsize nnext;
  char dest_buf [4096];
  char source_buf [4096];
  ifstream finDestination;
  ifstream finSource;
  off_t nleft;
  stat statDestination;
  stat statSource;
  size_t local_2580;
  undefined1 local_2568 [4096];
  undefined1 local_1568 [4104];
  undefined4 local_560;
  long local_550 [65];
  long local_348 [65];
  size_t local_140;
  stat local_138;
  stat local_a8;
  byte local_1;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(pcVar3,&local_a8);
  if (iVar2 == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = stat(pcVar3,&local_138);
    if (iVar2 == 0) {
      if (local_a8.st_size == local_138.st_size) {
        if (local_a8.st_size == 0) {
          local_1 = 0;
        }
        else {
          local_140 = local_a8.st_size;
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(local_348,pcVar3,_S_in);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(local_550,pcVar3,_S_in);
          bVar1 = std::ios::operator!((ios *)((long)local_348 + *(long *)(local_348[0] + -0x18)));
          if (((bVar1 & 1) == 0) &&
             (bVar1 = std::ios::operator!((ios *)((long)local_550 + *(long *)(local_550[0] + -0x18))
                                         ), (bVar1 & 1) == 0)) {
            for (; 0 < (long)local_140; local_140 = local_140 - local_2580) {
              if ((long)local_140 < 0x1001) {
                local_2580 = local_140;
              }
              else {
                local_2580 = 0x1000;
              }
              std::istream::read((char *)local_348,(long)local_1568);
              std::istream::read((char *)local_550,(long)local_2568);
              sVar4 = std::istream::gcount();
              if ((sVar4 != local_2580) || (sVar4 = std::istream::gcount(), sVar4 != local_2580)) {
                local_1 = 1;
                goto LAB_00f36e7b;
              }
              iVar2 = memcmp(local_1568,local_2568,local_2580);
              if (iVar2 != 0) {
                local_1 = 1;
                goto LAB_00f36e7b;
              }
            }
            local_1 = 0;
          }
          else {
            local_1 = 1;
          }
LAB_00f36e7b:
          local_560 = 1;
          std::ifstream::~ifstream(local_550);
          std::ifstream::~ifstream(local_348);
        }
      }
      else {
        local_1 = 1;
      }
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SystemTools::FilesDiffer(const std::string& source,
                              const std::string& destination)
{

#if defined(_WIN32)
  WIN32_FILE_ATTRIBUTE_DATA statSource;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(source).c_str(),
                           GetFileExInfoStandard, &statSource) == 0) {
    return true;
  }

  WIN32_FILE_ATTRIBUTE_DATA statDestination;
  if (GetFileAttributesExW(
        Encoding::ToWindowsExtendedPath(destination).c_str(),
        GetFileExInfoStandard, &statDestination) == 0) {
    return true;
  }

  if (statSource.nFileSizeHigh != statDestination.nFileSizeHigh ||
      statSource.nFileSizeLow != statDestination.nFileSizeLow) {
    return true;
  }

  if (statSource.nFileSizeHigh == 0 && statSource.nFileSizeLow == 0) {
    return false;
  }
  auto nleft =
    ((__int64)statSource.nFileSizeHigh << 32) + statSource.nFileSizeLow;

#else

  struct stat statSource;
  if (stat(source.c_str(), &statSource) != 0) {
    return true;
  }

  struct stat statDestination;
  if (stat(destination.c_str(), &statDestination) != 0) {
    return true;
  }

  if (statSource.st_size != statDestination.st_size) {
    return true;
  }

  if (statSource.st_size == 0) {
    return false;
  }
  off_t nleft = statSource.st_size;
#endif

#if defined(_WIN32)
  kwsys::ifstream finSource(source.c_str(), (std::ios::binary | std::ios::in));
  kwsys::ifstream finDestination(destination.c_str(),
                                 (std::ios::binary | std::ios::in));
#else
  kwsys::ifstream finSource(source.c_str());
  kwsys::ifstream finDestination(destination.c_str());
#endif
  if (!finSource || !finDestination) {
    return true;
  }

  // Compare the files a block at a time.
  char source_buf[KWSYS_ST_BUFFER];
  char dest_buf[KWSYS_ST_BUFFER];
  while (nleft > 0) {
    // Read a block from each file.
    std::streamsize nnext = (nleft > KWSYS_ST_BUFFER)
      ? KWSYS_ST_BUFFER
      : static_cast<std::streamsize>(nleft);
    finSource.read(source_buf, nnext);
    finDestination.read(dest_buf, nnext);

    // If either failed to read assume they are different.
    if (static_cast<std::streamsize>(finSource.gcount()) != nnext ||
        static_cast<std::streamsize>(finDestination.gcount()) != nnext) {
      return true;
    }

    // If this block differs the file differs.
    if (memcmp(static_cast<const void*>(source_buf),
               static_cast<const void*>(dest_buf),
               static_cast<size_t>(nnext)) != 0) {
      return true;
    }

    // Update the byte count remaining.
    nleft -= nnext;
  }

  // No differences found.
  return false;
}